

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O1

_Bool BitmapSetPixelColor(Bitmap *bitmap,uint16_t x,uint16_t y,RGBTRIPLE *color)

{
  ushort uVar1;
  ushort uVar2;
  RGBTRIPLE *pRVar3;
  uint8_t uVar4;
  undefined8 in_RAX;
  _Bool _Var5;
  int iVar6;
  undefined6 in_register_00000032;
  
  uVar1 = (bitmap->dibHeader).bcWidth;
  if ((x < uVar1) && (uVar2 = (bitmap->dibHeader).bcHeight, y < uVar2)) {
    pRVar3 = bitmap->pixels;
    iVar6 = ((uint)uVar2 + ~(uint)y) * (uint)uVar1 + (int)CONCAT62(in_register_00000032,x);
    pRVar3[iVar6].rgbtRed = color->rgbtRed;
    uVar4 = color->rgbtGreen;
    pRVar3 = pRVar3 + iVar6;
    pRVar3->rgbtBlue = color->rgbtBlue;
    pRVar3->rgbtGreen = uVar4;
    _Var5 = true;
  }
  else {
    _Var5 = false;
    fprintf(_stderr,"%s: Invalid pixel indices (x:%d<%d, y:%d<%d)\n","BitmapSetPixelColor",
            CONCAT62(in_register_00000032,x) & 0xffffffff,(ulong)uVar1,y,
            CONCAT44((int)((ulong)in_RAX >> 0x20),(uint)(bitmap->dibHeader).bcHeight));
  }
  return _Var5;
}

Assistant:

bool BitmapSetPixelColor(Bitmap *bitmap, uint16_t x, uint16_t y, const RGBTRIPLE *color) {
  if (bitmap->dibHeader.bcWidth <= x || bitmap->dibHeader.bcHeight <= y) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Invalid pixel indices (x:%d<%d, y:%d<%d)\n", __FUNCTION_NAME__, x, bitmap->dibHeader.bcWidth, y, bitmap->dibHeader.bcHeight);
#endif
    return false;
  }
  bitmap->pixels[x + bitmap->dibHeader.bcWidth * (bitmap->dibHeader.bcHeight - y - 1)] = *color;
  return true;
}